

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument.cpp
# Opt level: O0

Argument * __thiscall cppgenerate::Argument::operator=(Argument *this,Argument *other)

{
  Argument *other_local;
  Argument *this_local;
  
  if (this != other) {
    std::__cxx11::string::operator=((string *)this,(string *)other);
    std::__cxx11::string::operator=((string *)&this->m_name,(string *)&other->m_name);
    std::__cxx11::string::operator=
              ((string *)&this->m_defaultValue,(string *)&other->m_defaultValue);
    this->m_isConst = (bool)(other->m_isConst & 1);
    this->m_argPassType = other->m_argPassType;
  }
  return this;
}

Assistant:

Argument& Argument::operator=( const Argument& other ){
    if( this != &other ){
        m_type = other.m_type;
        m_name = other.m_name;
        m_defaultValue = other.m_defaultValue;
        m_isConst = other.m_isConst;
        m_argPassType = other.m_argPassType;
    }

    return *this;
}